

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O3

void __thiscall
amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>
          (GpuBndryFuncFab<PeleLMCCFillExtDir> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp,FilfcFace *fillfunc)

{
  Box *pBVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  double *pdVar5;
  pointer pBVar6;
  undefined8 uVar7;
  ulong uVar8;
  ProbParm *pPVar9;
  ACParm *pAVar10;
  undefined8 uVar11;
  double *pdVar12;
  GpuBndryFuncFab<PeleLMCCFillExtDir> *pGVar13;
  GpuBndryFuncFab<PeleLMCCFillExtDir> *pGVar14;
  Real RVar15;
  Real RVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  IndexType IVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  IndexType IVar31;
  uint uVar32;
  long lVar33;
  Real *pRVar34;
  Real *pRVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  long lVar39;
  bool bVar40;
  byte bVar41;
  int iVar42;
  int iVar44;
  undefined1 auVar43 [16];
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  int sm_1;
  int sm;
  Box bx_1;
  Box bx_2;
  Box gdomain;
  Box bx_8;
  uint bitval_1;
  uint bitval;
  int bg;
  Box local_4e8;
  ulong local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  Real local_4a8;
  int local_49c;
  int local_498;
  uint local_494;
  CoordType local_490;
  uint local_48c;
  uint local_488;
  int local_484;
  int local_480;
  int local_47c;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  long local_458;
  uint local_450;
  int local_44c;
  int aiStack_448 [2];
  uint uStack_440;
  int local_43c [3];
  IndexType IStack_430;
  long local_420;
  undefined1 local_418 [72];
  int iStack_3d0;
  uint local_3cc;
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint auStack_3b8 [2];
  IndexType IStack_3b0;
  uint local_3ac;
  BCRec *local_3a8;
  undefined8 local_3a0;
  int iStack_398;
  uint uStack_394;
  uint uStack_390;
  ulong uStack_38c;
  uint local_384;
  undefined8 local_380;
  uint local_378;
  uint local_374;
  Real local_370;
  int local_368;
  Real local_364;
  int local_35c;
  uint local_358;
  long local_354;
  int local_34c;
  long local_348;
  int local_340;
  uint local_33c;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  Real local_320;
  uint local_318;
  uint local_314;
  uint local_310;
  CoordType local_30c;
  Real local_308;
  int local_300;
  int local_2f8 [6];
  uint local_2e0;
  undefined1 local_2d0 [20];
  undefined1 auStack_2bc [8];
  int iStack_2b4;
  undefined8 local_2b0;
  Dim3 local_2a8;
  undefined8 local_29c;
  ulong local_294;
  int local_28c;
  undefined8 local_288;
  uint local_280;
  int iStack_27c;
  uint uStack_278;
  int iStack_274;
  uint auStack_270 [4];
  pointer local_260;
  int local_258;
  uint auStack_254 [4];
  ulong uStack_244;
  int local_23c;
  Real local_238;
  uint local_230;
  uint local_22c;
  uint local_228;
  ulong local_224;
  int local_21c;
  Real local_218;
  uint local_210;
  ulong local_20c;
  int local_204;
  Real local_200;
  int local_1f8;
  uint local_1f4;
  IndexType local_1f0;
  uint uStack_1ec;
  int local_1e8;
  undefined8 uStack_1e4;
  uint uStack_1dc;
  uint local_1d8;
  uint uStack_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8 [2];
  undefined8 local_1c0;
  uint local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac [4];
  undefined8 local_19c;
  int local_194;
  undefined8 local_190;
  int local_188;
  uint local_184;
  undefined8 local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  double *local_160;
  GpuBndryFuncFab<PeleLMCCFillExtDir> *local_158;
  long local_150;
  pointer local_148;
  long local_140;
  undefined1 local_138 [16];
  Real local_128;
  long local_120;
  Real local_118;
  uint local_10c;
  ulong local_108;
  ulong local_100;
  Box *local_f8;
  ulong local_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  undefined8 local_98;
  uint local_90;
  Real local_88;
  Real RStack_80;
  Real local_78;
  Real RStack_70;
  Real local_68;
  Real RStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  bVar41 = 0;
  local_158 = this;
  iVar26 = (bx->bigend).vect[0];
  uVar4 = *(undefined8 *)(bx->smallend).vect;
  iVar37 = (int)uVar4;
  iVar36 = (int)((ulong)uVar4 >> 0x20);
  uVar28 = iVar26 - iVar37;
  uVar29 = uVar28 + 1;
  local_4c0 = (ulong)uVar29;
  uVar4 = *(undefined8 *)((bx->bigend).vect + 1);
  iVar42 = (int)uVar4;
  iVar44 = (int)((ulong)uVar4 >> 0x20);
  uVar23 = iVar42 - iVar36;
  uVar24 = uVar23 + 1;
  local_478 = (ulong)uVar24;
  iVar22 = (bx->smallend).vect[2];
  uVar38 = iVar44 - iVar22;
  local_90 = uVar38 + 1;
  local_470 = (ulong)local_90;
  local_98 = CONCAT44(uVar24,uVar29);
  uVar2 = (bx->btype).itype;
  aiStack_448 = *(int (*) [2])(geom->domain).smallend.vect;
  uVar4 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  uVar7 = *(undefined8 *)((geom->domain).bigend.vect + 2);
  local_43c[1] = (int)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
  local_43c[2] = (int)uVar7;
  IStack_430.itype = SUB84(uVar7,4);
  uVar11 = stack0xfffffffffffffbcc;
  uStack_440 = (uint)uVar4;
  local_43c[0] = (int)((ulong)uVar4 >> 0x20);
  lVar27 = 0;
  IStack_430.itype = SUB84(uVar7,4);
  IVar31.itype = IStack_430.itype;
  unique0x10002842 = uVar11;
  do {
    uVar30 = 1 << ((byte)lVar27 & 0x1f);
    uVar25 = (uint)lVar27;
    local_43c[lVar27] =
         (local_43c[lVar27] + (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
         (uint)((IVar31.itype >> (uVar25 & 0x1f) & 1) != 0);
    if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
      IVar31.itype = ~uVar30 & IStack_430.itype;
    }
    else {
      IVar31.itype = uVar30 | IStack_430.itype;
    }
    IStack_430.itype = IVar31.itype;
    lVar27 = lVar27 + 1;
  } while (lVar27 != 3);
  local_2f8[4] = local_43c[1];
  local_2f8[5] = local_43c[2];
  local_2e0 = IVar31.itype;
  local_2f8[0] = aiStack_448[0];
  local_2f8[1] = aiStack_448[1];
  local_2f8[2] = uStack_440;
  local_2f8[3] = local_43c[0];
  lVar27 = 0;
  do {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar27 + 0x19) == '\x01') {
      iVar3 = *(int *)((long)&local_98 + lVar27 * 4);
      local_2f8[lVar27] = local_2f8[lVar27] - iVar3;
      local_2f8[lVar27 + 3] = local_2f8[lVar27 + 3] + iVar3;
    }
    lVar27 = lVar27 + 1;
  } while (lVar27 != 3);
  auVar43._0_4_ = -(uint)(local_2f8[4] < iVar42);
  auVar43._4_4_ = -(uint)(local_2f8[5] < iVar44);
  auVar43._8_4_ = -(uint)(iVar37 < local_2f8[0]);
  auVar43._12_4_ = -(uint)(iVar36 < local_2f8[1]);
  iVar37 = movmskps(iVar26,auVar43);
  if (((iVar37 != 0) || (local_2f8[3] < iVar26)) || (iVar22 < local_2f8[2])) {
    local_f8 = bx;
    pdVar5 = (dest->super_BaseFab<double>).dptr;
    local_160 = pdVar5;
    local_484 = (dest->super_BaseFab<double>).nvar;
    pBVar1 = &(dest->super_BaseFab<double>).domain;
    iVar26 = (dest->super_BaseFab<double>).domain.smallend.vect[1];
    local_138._0_8_ = *(undefined8 *)(pBVar1->smallend).vect;
    local_150 = (long)(dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar33 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[0];
    local_68 = (geom->prob_domain).xhi[1];
    RStack_60 = (geom->prob_domain).xhi[2];
    local_78 = (geom->prob_domain).xlo[2];
    RStack_70 = (geom->prob_domain).xhi[0];
    local_88 = (geom->prob_domain).xlo[0];
    RStack_80 = (geom->prob_domain).xlo[1];
    uVar4 = *(undefined8 *)(geom->domain).bigend.vect;
    local_58 = *(undefined8 *)(geom->domain).smallend.vect;
    uStack_50 = (undefined4)*(undefined8 *)((geom->domain).smallend.vect + 2);
    uStack_4c = (undefined4)uVar4;
    uStack_48 = (undefined4)((ulong)uVar4 >> 0x20);
    uStack_44 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    local_e8 = *(undefined4 *)(geom->super_CoordSys).dx;
    uStack_e4 = *(undefined4 *)((long)(geom->super_CoordSys).dx + 4);
    uStack_e0 = *(undefined4 *)((geom->super_CoordSys).dx + 1);
    uStack_dc = *(undefined4 *)((long)(geom->super_CoordSys).dx + 0xc);
    local_128 = (geom->super_CoordSys).dx[2];
    uVar25 = (uint)(byte)(geom->super_CoordSys).field_0x51;
    local_488 = (uint)(byte)(geom->super_CoordSys).field_0x52;
    local_48c = (uint)(byte)(geom->super_CoordSys).field_0x53;
    local_490 = (geom->super_CoordSys).c_sys;
    pBVar6 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_418._0_4_ = local_2f8[0] - uVar29;
    local_460 = CONCAT44(local_2f8[2],local_2f8[1]);
    local_418._4_4_ = local_2f8[1];
    local_418._8_4_ = local_2f8[2];
    local_418._12_4_ = local_2f8[0] + -1;
    lVar39 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_420 = (lVar33 - (pBVar1->smallend).vect[0]) + 1;
    local_120 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_3ac = IVar31.itype & 0xfffffffe;
    local_468 = CONCAT44(local_2f8[5],local_2f8[4]);
    local_418._16_4_ = local_2f8[4];
    local_418._20_4_ = local_2f8[5];
    local_418._24_4_ = local_3ac;
    local_4c8 = (ulong)(uint)local_2f8[2];
    local_4b0 = (ulong)(uint)local_2f8[5];
    lVar27 = 0;
    do {
      uVar32 = 1 << ((byte)lVar27 & 0x1f);
      uVar30 = (uint)lVar27;
      *(uint *)(local_418 + lVar27 * 4 + 0xc) =
           (*(int *)(local_418 + lVar27 * 4 + 0xc) + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_418._24_4_ >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_418._24_4_ = ~uVar32 & local_418._24_4_;
      }
      else {
        local_418._24_4_ = uVar32 | local_418._24_4_;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_458 = (lVar39 - iVar26) * local_420;
    local_44c = local_2f8[1] - uVar24;
    local_498 = local_2f8[1] + -1;
    uStack_390 = IVar31.itype & 0xfffffffd;
    local_418._28_4_ = local_2f8[0];
    local_418._32_4_ = local_44c;
    local_418._36_4_ = local_2f8[2];
    local_418._44_4_ = local_498;
    local_418._40_4_ = local_2f8[3];
    local_418._48_4_ = local_2f8[5];
    local_418._52_4_ = uStack_390;
    lVar27 = 0;
    do {
      uVar30 = 1 << ((byte)lVar27 & 0x1f);
      uVar24 = (uint)lVar27;
      *(uint *)(local_418 + lVar27 * 4 + 0x28) =
           (*(int *)(local_418 + lVar27 * 4 + 0x28) + (uint)((uVar2 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_418._52_4_ >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar24 & 0x1f) & 1) == 0) {
        local_418._52_4_ = ~uVar30 & local_418._52_4_;
      }
      else {
        local_418._52_4_ = uVar30 | local_418._52_4_;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_4b8 = CONCAT44(local_2f8[1],local_2f8[0]);
    local_4a8 = (Real)CONCAT44(local_2f8[4],local_2f8[3]);
    local_49c = local_2f8[2] - local_90;
    uVar24 = local_2f8[2] - 1;
    local_374 = IVar31.itype & 0xfffffffb;
    local_418._56_4_ = local_2f8[0];
    local_418._60_4_ = local_2f8[1];
    local_418._64_4_ = local_49c;
    stack0xfffffffffffffc2c = local_4a8;
    local_3cc = uVar24;
    local_3c8 = local_374;
    lVar27 = 0;
    do {
      uVar32 = 1 << ((byte)lVar27 & 0x1f);
      uVar30 = (uint)lVar27;
      *(uint *)(local_418 + lVar27 * 4 + 0x44) =
           (*(int *)(local_418 + lVar27 * 4 + 0x44) + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)((local_3c8 >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_3c8 = ~uVar32 & local_3c8;
      }
      else {
        local_3c8 = uVar32 | local_3c8;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_10c = IVar31.itype & 1;
    uStack_3c4 = (IVar31.itype & 1 ^ 1) + local_2f8[3];
    local_a0 = (ulong)uVar28;
    local_450 = (uVar29 + uStack_3c4) - 1;
    local_100 = (ulong)uStack_3c4;
    uStack_3c0 = local_2f8[1];
    uStack_3bc = local_2f8[2];
    auStack_3b8[0] = local_450;
    auStack_3b8[1] = local_2f8[4];
    IStack_3b0.itype = local_2f8[5];
    lVar27 = 0;
    do {
      uVar29 = 1 << ((byte)lVar27 & 0x1f);
      uVar28 = (uint)lVar27;
      auStack_3b8[lVar27] =
           (auStack_3b8[lVar27] + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)((local_3ac >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_3ac = ~uVar29 & local_3ac;
      }
      else {
        local_3ac = uVar29 | local_3ac;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    bVar40 = (IVar31.itype & 2) == 0;
    local_178 = (ulong)bVar40;
    iVar26 = (uint)bVar40 + local_2f8[4];
    local_f0 = (ulong)uVar23;
    local_3a8 = (BCRec *)CONCAT44(iVar26,local_2f8[0]);
    local_3a0 = (ProbParm *)CONCAT44(local_2f8[3],local_2f8[2]);
    iStack_398 = uVar23 + iVar26;
    uStack_394 = local_2f8[5];
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)((long)&local_3a0 + lVar27 * 4 + 4) =
           (*(int *)((long)&local_3a0 + lVar27 * 4 + 4) +
           (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((uStack_390 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        uStack_390 = ~uVar28 & uStack_390;
      }
      else {
        uStack_390 = uVar28 | uStack_390;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_180 = CONCAT44(local_180._4_4_,IVar31.itype >> 2) & 0xffffffff00000001;
    local_384 = (IVar31.itype >> 2 & 1 ^ 1) + local_2f8[5];
    local_108 = (ulong)uVar38;
    local_378 = (local_90 + local_384) - 1;
    uStack_38c = local_4b8;
    local_d0 = (ulong)local_384;
    local_380 = local_4a8;
    local_d8 = (ulong)local_378;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)((long)&local_380 + lVar27 * 4) =
           (*(int *)((long)&local_380 + lVar27 * 4) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_374 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_374 = ~uVar28 & local_374;
      }
      else {
        local_374 = uVar28 | local_374;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    lVar27 = 0;
    local_138._8_8_ = lVar39 << 0x20 | lVar33 + 1U & 0xffffffff;
    local_140 = (local_120 - local_150) * local_458;
    local_118 = time;
    local_148 = pBVar6 + bcomp;
    local_494 = uVar25;
    local_480 = dcomp;
    local_47c = numcomp;
    do {
      uVar20 = uStack_dc;
      uVar19 = uStack_e0;
      uVar18 = uStack_e4;
      uVar17 = local_e8;
      RVar16 = local_118;
      RVar15 = local_128;
      uVar47 = *(ulong *)(local_418 + lVar27);
      uVar8 = *(ulong *)(local_418 + lVar27 + 0xc);
      local_4e8.smallend.vect[2] = (int)*(undefined8 *)(local_418 + lVar27 + 8);
      uVar46 = *(ulong *)(bx->smallend).vect;
      uVar45 = CONCAT44(-(uint)((int)(uVar46 >> 0x20) < (int)(uVar47 >> 0x20)),
                        -(uint)((int)uVar46 < (int)uVar47));
      uVar46 = ~uVar45 & uVar46 | uVar47 & uVar45;
      local_4e8.smallend.vect[0] = (int)uVar46;
      local_4e8.smallend.vect[1] = (int)(uVar46 >> 0x20);
      iVar26 = (bx->smallend).vect[2];
      if (iVar26 < local_4e8.smallend.vect[2]) {
        iVar26 = local_4e8.smallend.vect[2];
      }
      uVar46 = *(ulong *)(bx->bigend).vect;
      uVar47 = CONCAT44(-(uint)((int)(uVar8 >> 0x20) < (int)(uVar46 >> 0x20)),
                        -(uint)((int)uVar8 < (int)uVar46));
      uVar46 = ~uVar47 & uVar46 | uVar8 & uVar47;
      local_4e8.bigend.vect[0] = (int)uVar46;
      local_4e8.bigend.vect[1] = (int)(uVar46 >> 0x20);
      local_4e8.bigend.vect[2] = (int)*(undefined8 *)(local_418 + lVar27 + 0x14);
      iVar22 = (bx->bigend).vect[2];
      if (local_4e8.bigend.vect[2] < iVar22) {
        iVar22 = local_4e8.bigend.vect[2];
      }
      local_4e8.btype.itype = (uint)((ulong)*(undefined8 *)(local_418 + lVar27 + 0x14) >> 0x20);
      local_4e8.bigend.vect[2] = iVar22;
      local_2d0._8_4_ = SUB84(pdVar5,0);
      local_2d0._12_4_ = (undefined4)((ulong)pdVar5 >> 0x20);
      stack0xfffffffffffffd40 = local_420;
      stack0xfffffffffffffd48 = local_458;
      local_2b0 = local_140;
      local_2a8.x = local_138._0_4_;
      local_2a8.y = local_138._4_4_;
      local_2a8.z = (int)local_150;
      local_29c = local_138._8_8_;
      local_294._0_4_ = (int)local_120;
      local_294._4_4_ = local_484;
      local_288._4_4_ = local_47c;
      local_288._0_4_ = local_480;
      auStack_270[0] = local_43c[1];
      auStack_270[1] = local_43c[2];
      auStack_270[2] = IStack_430.itype;
      local_280 = aiStack_448[0];
      iStack_27c = aiStack_448[1];
      uStack_278 = uStack_440;
      iStack_274 = local_43c[0];
      local_260 = local_148;
      pPVar9 = (this->m_user_f).lprobparm;
      pAVar10 = (this->m_user_f).lacparm;
      auStack_254[3] = (uint)((ulong)*(undefined8 *)((long)&(this->m_user_f).lacparm + 4) >> 0x20);
      uStack_244 = *(undefined8 *)((long)&(this->m_user_f).lpmfdata + 4);
      local_258 = (int)pPVar9;
      auStack_254[0] = (uint)((ulong)pPVar9 >> 0x20);
      auStack_254[1] = (uint)pAVar10;
      auStack_254[2] = (uint)((ulong)pAVar10 >> 0x20);
      pRVar34 = &local_88;
      pRVar35 = &local_238;
      for (lVar33 = 10; lVar33 != 0; lVar33 = lVar33 + -1) {
        *pRVar35 = *pRVar34;
        pRVar34 = pRVar34 + (ulong)bVar41 * -2 + 1;
        pRVar35 = pRVar35 + (ulong)bVar41 * -2 + 1;
      }
      uStack_1e4._4_4_ = uVar19;
      uStack_1e4._0_4_ = uVar18;
      local_1d8 = SUB84(RVar15,0);
      uStack_1d4 = (uint)((ulong)RVar15 >> 0x20);
      local_1cc = local_488;
      local_1c8[1] = local_490;
      local_1c8[0] = local_48c;
      local_1b8 = orig_comp;
      local_4e8.smallend.vect[2] = iVar26;
      local_1e8 = uVar17;
      uStack_1dc = uVar20;
      local_1d0 = uVar25;
      local_1c0 = RVar16;
      For<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_1_>
                (&local_4e8,(anon_class_288_10_b99250ba *)local_2d0);
      pBVar1 = local_f8;
      pGVar13 = local_158;
      pdVar12 = local_160;
      lVar27 = lVar27 + 0x1c;
    } while (lVar27 != 0xa8);
    local_1f0.itype = (uint)local_4b8;
    local_2d0._0_4_ = local_1f0.itype - (int)local_4c0;
    iVar26 = local_1f0.itype - 1;
    auStack_270[3] = IVar31.itype & 0xfffffffc;
    local_4c0 = CONCAT44(local_4c0._4_4_,local_2d0._0_4_);
    local_2d0._4_4_ = local_44c;
    local_2d0._8_4_ = (undefined4)local_4c8;
    local_2d0._12_4_ = iVar26;
    IVar21.itype = (uint)local_4b0;
    stack0xfffffffffffffd40 = CONCAT44(IVar21.itype,local_498);
    auStack_2bc._4_4_ = IVar31.itype & 0xfffffffc;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)(auStack_2bc + lVar27 * 4 + -8) =
           (*(int *)(auStack_2bc + lVar27 * 4 + -8) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)(((uint)auStack_2bc._4_4_ >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        auStack_2bc._4_4_ = ~uVar28 & auStack_2bc._4_4_;
      }
      else {
        auStack_2bc._4_4_ = uVar28 | auStack_2bc._4_4_;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    stack0xfffffffffffffd48 = CONCAT44((int)local_100,auStack_2bc._4_4_);
    local_2b0 = CONCAT44(local_2d0._8_4_,local_44c);
    local_2a8.y = local_498;
    local_2a8.x = local_450;
    local_2a8.z = IVar21.itype;
    local_29c._0_4_ = IVar31.itype & 0xfffffffc;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      (&local_2a8.x)[lVar27] =
           ((&local_2a8.x)[lVar27] + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_29c >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_29c._0_4_ = ~uVar28 & (uint)local_29c;
      }
      else {
        local_29c._0_4_ = uVar28 | (uint)local_29c;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    iVar22 = (int)(IVar31.itype << 0x1e) >> 0x1f;
    local_a8 = (ulong)(iVar22 + 1);
    uStack_278 = iVar22 + (int)local_468 + 1;
    local_168 = (ulong)uStack_278;
    iVar37 = (int)local_f0;
    auStack_270[1] = uStack_278 + iVar37;
    local_170 = (ulong)auStack_270[1];
    local_29c._4_4_ = local_2d0._0_4_;
    local_294 = local_460 & 0xffffffff00000000 | (ulong)uStack_278;
    local_28c = iVar26;
    local_288 = local_468 & 0xffffffff00000000 | (ulong)auStack_270[1];
    local_280 = IVar31.itype & 0xfffffffc;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      (&local_28c)[lVar27] =
           ((&local_28c)[lVar27] + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_280 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_280 = ~uVar28 & local_280;
      }
      else {
        local_280 = uVar28 | local_280;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    iStack_27c = (int)local_100;
    iStack_274 = local_2d0._8_4_;
    auStack_270[0] = local_450;
    auStack_270[2] = IVar21.itype;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      auStack_270[lVar27] =
           (auStack_270[lVar27] + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((auStack_270[3] >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        auStack_270[3] = ~uVar28 & auStack_270[3];
      }
      else {
        auStack_270[3] = uVar28 | auStack_270[3];
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    uVar46 = local_4b8 & 0xffffffff00000000;
    local_c8 = (ulong)(uint)local_2d0._0_4_;
    local_c0 = (ulong)(local_1f0.itype - 1);
    local_1f4 = IVar31.itype & 0xfffffffa;
    local_260 = (BCRec *)(uVar46 | (uint)local_2d0._0_4_);
    local_258 = local_49c;
    auStack_254[0] = local_1f0.itype - 1;
    auStack_254[1] = (uint)(((ulong)local_4a8 & 0xffffffff00000000) >> 0x20);
    auStack_254[2] = uVar24;
    auStack_254[3] = local_1f4;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      auStack_254[lVar27] =
           (auStack_254[lVar27] + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((auStack_254[3] >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        auStack_254[3] = ~uVar28 & auStack_254[3];
      }
      else {
        auStack_254[3] = uVar28 | auStack_254[3];
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_b8 = local_100 & 0xffffffff;
    uStack_244 = uVar46 | local_100 & 0xffffffff;
    local_b0 = (ulong)local_450;
    local_200 = (Real)((ulong)local_4a8 & 0xffffffff00000000 | (ulong)local_450);
    local_23c = local_49c;
    local_238 = local_200;
    local_230 = uVar24;
    local_22c = local_1f4;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)((long)&local_238 + lVar27 * 4) =
           (*(int *)((long)&local_238 + lVar27 * 4) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_22c >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_22c = ~uVar28 & local_22c;
      }
      else {
        local_22c = uVar28 | local_22c;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_228 = local_2d0._0_4_;
    local_224 = local_460 & 0xffffffff | local_d0 << 0x20;
    local_21c = iVar26;
    local_218 = (Real)(local_468 & 0xffffffff | local_d8 << 0x20);
    local_210 = local_1f4;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      (&local_21c)[lVar27] =
           ((&local_21c)[lVar27] + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_210 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_210 = ~uVar28 & local_210;
      }
      else {
        local_210 = uVar28 | local_210;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_204 = (IVar21.itype + 1) - (int)local_180;
    iVar36 = (int)local_470;
    local_20c = uStack_244;
    local_1f8 = iVar36 + local_204 + -1;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)((long)&local_200 + lVar27 * 4) =
           (*(int *)((long)&local_200 + lVar27 * 4) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_1f4 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_1f4 = ~uVar28 & local_1f4;
      }
      else {
        local_1f4 = uVar28 | local_1f4;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    uStack_1ec = (int)(local_4b8 >> 0x20) - (int)local_478;
    local_180 = (ulong)uStack_1ec << 0x20;
    local_478 = uVar46 - 0x100000000;
    local_184 = IVar31.itype & 0xfffffff9;
    local_1e8 = local_49c;
    uStack_1e4 = local_478 | (ulong)local_4a8 & 0xffffffff;
    uStack_1dc = uVar24;
    local_1d8 = local_184;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)((long)&uStack_1e4 + lVar27 * 4) =
           (*(int *)((long)&uStack_1e4 + lVar27 * 4) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0))
           - (uint)((local_1d8 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_1d8 = ~uVar28 & local_1d8;
      }
      else {
        local_1d8 = uVar28 | local_1d8;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_4c8._0_4_ = (int)((ulong)local_4a8 >> 0x20);
    local_1d0 = (int)local_178 + (int)local_4c8;
    uStack_1d4 = local_1f0.itype;
    local_1cc = local_49c;
    local_1c8[0] = local_4a8._0_4_;
    local_1c8[1] = iVar37 + local_1d0;
    local_1c0._0_4_ = uVar24;
    local_1c0._4_4_ = IVar31.itype & 0xfffffff9;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      local_1c8[lVar27] =
           (local_1c8[lVar27] + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_1c0._4_4_ >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_1c0._4_4_ = ~uVar28 & local_1c0._4_4_;
      }
      else {
        local_1c0._4_4_ = uVar28 | local_1c0._4_4_;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    uVar23 = (int)(IVar31.itype << 0x1d) >> 0x1f;
    local_470 = (ulong)uVar23;
    local_1b0 = IVar21.itype + 1 + uVar23;
    local_1b8 = local_1f0.itype;
    local_1b4 = local_44c;
    local_1ac[0] = local_4a8._0_4_;
    local_1ac[1] = local_498;
    local_1ac[2] = iVar36 + IVar21.itype + uVar23;
    local_1ac[3] = local_184;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      local_1ac[lVar27] =
           (local_1ac[lVar27] + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_1ac[3] >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_1ac[3] = ~uVar28 & local_1ac[3];
      }
      else {
        local_1ac[3] = uVar28 | local_1ac[3];
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    uVar23 = iVar22 + (int)local_4c8 + 1;
    uVar28 = (int)local_4c8 + iVar22 + iVar37 + 1;
    local_4b8 = (ulong)uVar23 << 0x20;
    local_178 = (ulong)uVar28 << 0x20;
    local_19c = CONCAT44(uVar23,local_1f0.itype);
    local_194 = local_1b0;
    local_190 = CONCAT44(uVar28,local_4a8._0_4_);
    local_188 = (int)local_108 + local_1b0;
    lVar27 = 0;
    do {
      uVar23 = 1 << ((byte)lVar27 & 0x1f);
      uVar28 = (uint)lVar27;
      *(uint *)((long)&local_190 + lVar27 * 4) =
           (*(int *)((long)&local_190 + lVar27 * 4) + (uint)((uVar2 >> (uVar28 & 0x1f) & 1) != 0)) -
           (uint)((local_184 >> (uVar28 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar28 & 0x1f) & 1) == 0) {
        local_184 = ~uVar23 & local_184;
      }
      else {
        local_184 = uVar23 | local_184;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    lVar27 = 0;
    local_4c8 = (ulong)local_4a8 >> 0x20;
    do {
      uVar20 = uStack_dc;
      uVar19 = uStack_e0;
      uVar18 = uStack_e4;
      uVar17 = local_e8;
      RVar16 = local_118;
      RVar15 = local_128;
      uVar47 = *(ulong *)(local_2d0 + lVar27);
      uVar8 = *(ulong *)(local_2d0 + lVar27 + 0xc);
      local_4e8.smallend.vect[2] = (int)*(undefined8 *)(local_2d0 + lVar27 + 8);
      uVar46 = *(ulong *)(pBVar1->smallend).vect;
      uVar45 = CONCAT44(-(uint)((int)(uVar46 >> 0x20) < (int)(uVar47 >> 0x20)),
                        -(uint)((int)uVar46 < (int)uVar47));
      uVar46 = ~uVar45 & uVar46 | uVar47 & uVar45;
      local_4e8.smallend.vect[0] = (int)uVar46;
      local_4e8.smallend.vect[1] = (int)(uVar46 >> 0x20);
      iVar22 = (pBVar1->smallend).vect[2];
      if (iVar22 < local_4e8.smallend.vect[2]) {
        iVar22 = local_4e8.smallend.vect[2];
      }
      uVar46 = *(ulong *)(pBVar1->bigend).vect;
      uVar47 = CONCAT44(-(uint)((int)(uVar8 >> 0x20) < (int)(uVar46 >> 0x20)),
                        -(uint)((int)uVar8 < (int)uVar46));
      uVar46 = ~uVar47 & uVar46 | uVar8 & uVar47;
      local_4e8.bigend.vect[0] = (int)uVar46;
      local_4e8.bigend.vect[1] = (int)(uVar46 >> 0x20);
      local_4e8.bigend.vect[2] = (int)*(undefined8 *)(auStack_2bc + lVar27);
      iVar37 = (pBVar1->bigend).vect[2];
      if (local_4e8.bigend.vect[2] < iVar37) {
        iVar37 = local_4e8.bigend.vect[2];
      }
      local_4e8.btype.itype = (uint)((ulong)*(undefined8 *)(auStack_2bc + lVar27) >> 0x20);
      local_4e8.bigend.vect[2] = iVar37;
      local_418._8_4_ = SUB84(pdVar12,0);
      local_418._12_4_ = (undefined4)((ulong)pdVar12 >> 0x20);
      local_418._16_4_ = (undefined4)local_420;
      local_418._20_4_ = (undefined4)((ulong)local_420 >> 0x20);
      local_418._24_4_ = (undefined4)local_458;
      local_418._28_4_ = (undefined4)((ulong)local_458 >> 0x20);
      local_418._32_4_ = (undefined4)local_140;
      local_418._36_4_ = (undefined4)((ulong)local_140 >> 0x20);
      local_418._40_8_ = local_138._0_8_;
      local_418._48_4_ = (int)local_150;
      local_418._52_4_ = (undefined4)local_138._8_8_;
      local_418._56_4_ = SUB84(local_138._8_8_,4);
      local_418._60_4_ = (int)local_120;
      local_418._64_4_ = local_484;
      stack0xfffffffffffffc2c = (Real)CONCAT44(local_480,local_418._68_4_);
      local_3cc = local_47c;
      auStack_3b8[0] = local_43c[1];
      auStack_3b8[1] = (uint)stack0xfffffffffffffbcc;
      IStack_3b0.itype = SUB84(stack0xfffffffffffffbcc,4);
      local_3c8 = aiStack_448[0];
      uStack_3c4 = aiStack_448[1];
      uStack_3c0 = uStack_440;
      uStack_3bc = local_43c[0];
      local_3a8 = local_148;
      pAVar10 = (pGVar13->m_user_f).lacparm;
      uStack_390 = (uint)((ulong)*(undefined8 *)((long)&(pGVar13->m_user_f).lacparm + 4) >> 0x20);
      uStack_38c = *(undefined8 *)((long)&(pGVar13->m_user_f).lpmfdata + 4);
      local_3a0 = (pGVar13->m_user_f).lprobparm;
      iStack_398 = (int)pAVar10;
      uStack_394 = (uint)((ulong)pAVar10 >> 0x20);
      pRVar34 = &local_88;
      pRVar35 = (Real *)&local_380;
      for (lVar33 = 10; lVar33 != 0; lVar33 = lVar33 + -1) {
        *pRVar35 = *pRVar34;
        pRVar34 = pRVar34 + (ulong)bVar41 * -2 + 1;
        pRVar35 = pRVar35 + (ulong)bVar41 * -2 + 1;
      }
      local_318 = local_494;
      local_314 = local_488;
      local_310 = local_48c;
      local_30c = local_490;
      local_300 = orig_comp;
      local_4e8.smallend.vect[2] = iVar22;
      local_330 = uVar17;
      uStack_32c = uVar18;
      uStack_328 = uVar19;
      uStack_324 = uVar20;
      local_320 = RVar15;
      local_308 = RVar16;
      For<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_2_>
                (&local_4e8,(anon_class_288_10_b99250ba *)local_418);
      lVar33 = local_150;
      pGVar14 = local_158;
      pdVar5 = local_160;
      lVar27 = lVar27 + 0x1c;
    } while (lVar27 != 0x150);
    local_33c = IVar31.itype & 0xfffffff8;
    local_418._0_4_ = (undefined4)(local_c8 | local_180);
    local_418._4_4_ = (undefined4)((local_c8 | local_180) >> 0x20);
    local_418._8_4_ = local_49c;
    local_418._12_4_ = (undefined4)(local_c0 | local_478);
    local_418._16_4_ = (undefined4)((local_c0 | local_478) >> 0x20);
    local_418._20_4_ = uVar24;
    local_418._24_4_ = local_33c;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)(local_418 + lVar27 * 4 + 0xc) =
           (*(int *)(local_418 + lVar27 * 4 + 0xc) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_418._24_4_ >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_418._24_4_ = ~uVar28 & local_418._24_4_;
      }
      else {
        local_418._24_4_ = uVar28 | local_418._24_4_;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    iVar22 = SUB84(local_4a8,0) - local_10c;
    uStack_3c4 = iVar22 + 1;
    auStack_3b8[0] = (int)local_a0 + iVar22 + 1;
    local_418._28_4_ = (uint)local_180 | uStack_3c4;
    local_418._32_4_ = (undefined4)(local_180 >> 0x20);
    local_418._36_4_ = local_49c;
    local_418._40_8_ = local_478 | auStack_3b8[0];
    local_418._48_4_ = uVar24;
    local_418._52_4_ = local_33c;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)(local_418 + lVar27 * 4 + 0x28) =
           (*(int *)(local_418 + lVar27 * 4 + 0x28) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_418._52_4_ >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_418._52_4_ = ~uVar28 & local_418._52_4_;
      }
      else {
        local_418._52_4_ = uVar28 | local_418._52_4_;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_2d0._0_4_ = (int)local_4c0;
    local_2d0._8_4_ = (undefined4)(local_460 >> 0x20);
    local_2d0._4_4_ = (undefined4)local_168;
    local_418._56_4_ = (int)local_4c0;
    local_418._60_4_ = local_2d0._4_4_;
    local_418._64_4_ = local_49c;
    local_418._68_4_ = iVar26;
    iStack_3d0 = (int)local_170;
    local_3cc = uVar24;
    local_3c8 = local_33c;
    lVar27 = 0;
    do {
      uVar28 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)(local_418 + lVar27 * 4 + 0x44) =
           (*(int *)(local_418 + lVar27 * 4 + 0x44) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_3c8 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_3c8 = ~uVar28 & local_3c8;
      }
      else {
        local_3c8 = uVar28 | local_3c8;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    uStack_3c4 = (uint)local_4b8 | uStack_3c4;
    auStack_3b8[0] = (uint)local_178 | auStack_3b8[0];
    uStack_3c0 = (uint)(local_4b8 >> 0x20);
    uStack_3bc = local_49c;
    auStack_3b8[1] = (uint)(local_178 >> 0x20);
    IStack_3b0.itype = uVar24;
    local_3ac = local_33c;
    lVar27 = 0;
    do {
      uVar24 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      auStack_3b8[lVar27] =
           (auStack_3b8[lVar27] + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_3ac >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_3ac = ~uVar24 & local_3ac;
      }
      else {
        local_3ac = uVar24 | local_3ac;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_384 = (int)local_4b0 + (int)local_470 + 1;
    local_340 = (int)local_108 + 1 + (int)local_470 + (int)local_4b0;
    local_3a8 = (BCRec *)CONCAT44(local_44c,(int)local_4c0);
    local_3a0 = (ProbParm *)CONCAT44(iVar26,local_384);
    iStack_398 = local_498;
    uStack_394 = local_340;
    uStack_390 = local_33c;
    lVar27 = 0;
    do {
      uVar24 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)((long)&local_3a0 + lVar27 * 4 + 4) =
           (*(int *)((long)&local_3a0 + lVar27 * 4 + 4) +
           (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((uStack_390 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        uStack_390 = ~uVar24 & uStack_390;
      }
      else {
        uStack_390 = uVar24 | uStack_390;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    uStack_38c._4_4_ = local_44c;
    uStack_38c._0_4_ = (int)local_100;
    local_380 = (Real)CONCAT44(local_498,local_450);
    local_378 = local_340;
    local_374 = local_33c;
    lVar27 = 0;
    do {
      uVar24 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)((long)&local_380 + lVar27 * 4) =
           (*(int *)((long)&local_380 + lVar27 * 4) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_374 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_374 = ~uVar24 & local_374;
      }
      else {
        local_374 = uVar24 | local_374;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    local_370 = (Real)CONCAT44(local_2d0._4_4_,(int)local_4c0);
    local_368 = local_384;
    local_364 = (Real)CONCAT44((int)local_170,iVar26);
    local_35c = local_340;
    local_358 = local_33c;
    lVar27 = 0;
    do {
      uVar24 = 1 << ((byte)lVar27 & 0x1f);
      uVar23 = (uint)lVar27;
      *(uint *)((long)&local_364 + lVar27 * 4) =
           (*(int *)((long)&local_364 + lVar27 * 4) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_358 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_358 = ~uVar24 & local_358;
      }
      else {
        local_358 = uVar24 | local_358;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    uVar23 = (int)local_a8 + (int)local_4c8;
    local_354 = ((ulong)uVar23 << 0x20) + local_b8;
    local_34c = local_384;
    local_348 = ((ulong)((int)local_f0 + uVar23) << 0x20) + local_b0;
    lVar27 = 0;
    do {
      uVar23 = 1 << ((byte)lVar27 & 0x1f);
      uVar24 = (uint)lVar27;
      *(uint *)((long)&local_348 + lVar27 * 4) =
           (*(int *)((long)&local_348 + lVar27 * 4) + (uint)((uVar2 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_33c >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar24 & 0x1f) & 1) == 0) {
        local_33c = ~uVar23 & local_33c;
      }
      else {
        local_33c = uVar23 | local_33c;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    lVar27 = 0;
    do {
      uStack_1dc = uStack_dc;
      uStack_1e4._4_4_ = uStack_e0;
      uStack_1e4._0_4_ = uStack_e4;
      local_1e8 = local_e8;
      local_1c0 = local_118;
      RVar15 = local_128;
      uVar47 = *(ulong *)(local_418 + lVar27);
      uVar8 = *(ulong *)(local_418 + lVar27 + 0xc);
      local_4e8.smallend.vect[2] = (int)*(undefined8 *)(local_418 + lVar27 + 8);
      uVar46 = *(ulong *)(pBVar1->smallend).vect;
      uVar45 = CONCAT44(-(uint)((int)(uVar46 >> 0x20) < (int)(uVar47 >> 0x20)),
                        -(uint)((int)uVar46 < (int)uVar47));
      uVar46 = ~uVar45 & uVar46 | uVar47 & uVar45;
      local_4e8.smallend.vect[0] = (int)uVar46;
      local_4e8.smallend.vect[1] = (int)(uVar46 >> 0x20);
      iVar26 = (pBVar1->smallend).vect[2];
      if (iVar26 < local_4e8.smallend.vect[2]) {
        iVar26 = local_4e8.smallend.vect[2];
      }
      uVar46 = *(ulong *)(pBVar1->bigend).vect;
      uVar47 = CONCAT44(-(uint)((int)(uVar8 >> 0x20) < (int)(uVar46 >> 0x20)),
                        -(uint)((int)uVar8 < (int)uVar46));
      uVar46 = ~uVar47 & uVar46 | uVar8 & uVar47;
      local_4e8.bigend.vect[0] = (int)uVar46;
      local_4e8.bigend.vect[1] = (int)(uVar46 >> 0x20);
      local_4e8.bigend.vect[2] = (int)*(undefined8 *)(local_418 + lVar27 + 0x14);
      iVar22 = (pBVar1->bigend).vect[2];
      if (local_4e8.bigend.vect[2] < iVar22) {
        iVar22 = local_4e8.bigend.vect[2];
      }
      local_4e8.btype.itype = (uint)((ulong)*(undefined8 *)(local_418 + lVar27 + 0x14) >> 0x20);
      local_4e8.bigend.vect[2] = iVar22;
      local_2d0._8_4_ = SUB84(pdVar5,0);
      local_2d0._12_4_ = (undefined4)((ulong)pdVar5 >> 0x20);
      stack0xfffffffffffffd40 = local_420;
      stack0xfffffffffffffd48 = local_458;
      local_2b0 = local_140;
      local_2a8.x = local_138._0_4_;
      local_2a8.y = local_138._4_4_;
      local_2a8.z = (int)lVar33;
      local_29c = local_138._8_8_;
      local_294._0_4_ = (int)local_120;
      local_294._4_4_ = local_484;
      local_288._4_4_ = local_47c;
      local_288._0_4_ = local_480;
      auStack_270[0] = local_43c[1];
      auStack_270[1] = local_43c[2];
      auStack_270[2] = IStack_430.itype;
      local_280 = aiStack_448[0];
      iStack_27c = aiStack_448[1];
      uStack_278 = uStack_440;
      iStack_274 = local_43c[0];
      local_260 = local_148;
      pPVar9 = (pGVar14->m_user_f).lprobparm;
      pAVar10 = (pGVar14->m_user_f).lacparm;
      auStack_254[3] =
           (uint)((ulong)*(undefined8 *)((long)&(pGVar14->m_user_f).lacparm + 4) >> 0x20);
      uStack_244 = *(undefined8 *)((long)&(pGVar14->m_user_f).lpmfdata + 4);
      local_258 = (int)pPVar9;
      auStack_254[0] = (uint)((ulong)pPVar9 >> 0x20);
      auStack_254[1] = (uint)pAVar10;
      auStack_254[2] = (uint)((ulong)pAVar10 >> 0x20);
      pRVar34 = &local_88;
      pRVar35 = &local_238;
      for (lVar39 = 10; lVar39 != 0; lVar39 = lVar39 + -1) {
        *pRVar35 = *pRVar34;
        pRVar34 = pRVar34 + (ulong)bVar41 * -2 + 1;
        pRVar35 = pRVar35 + (ulong)bVar41 * -2 + 1;
      }
      local_1d8 = SUB84(RVar15,0);
      uStack_1d4 = (uint)((ulong)RVar15 >> 0x20);
      local_1d0 = local_494;
      local_1cc = local_488;
      local_1c8[1] = local_490;
      local_1c8[0] = local_48c;
      local_1b8 = orig_comp;
      local_4e8.smallend.vect[2] = iVar26;
      For<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_3_>
                (&local_4e8,(anon_class_288_10_b99250ba *)local_2d0);
      lVar27 = lVar27 + 0x1c;
    } while (lVar27 != 0xe0);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::ccfcdoit (Box const& bx, FArrayBox& dest,
                              const int dcomp, const int numcomp,
                              Geometry const& geom, const Real time,
                              const Vector<BCRec>& bcr, const int bcomp,
                              const int orig_comp, FF&& fillfunc)
{
    const IntVect& len = bx.length();

    IndexType idxType = bx.ixType();
    Box const& domain = amrex::convert(geom.Domain(),idxType);
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

#ifdef AMREX_USE_GPU
    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // fill on the faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = { AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) };

        Vector<Box> face_boxes;
        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) face_boxes.push_back(tmp);
        }
        const int n_face_boxes = face_boxes.size();
        if (n_face_boxes == 1) {
            amrex::ParallelFor(face_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_face_boxes > 1) {
            AsyncArray<Box> face_boxes_aa(face_boxes.data(), n_face_boxes);
            Box* boxes_p = face_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : face_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_face_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif
        Vector<Box> edge_boxes;
        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) edge_boxes.push_back(tmp);
        }
        const int n_edge_boxes = edge_boxes.size();
        if (n_edge_boxes == 1) {
            amrex::ParallelFor(edge_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_edge_boxes > 1) {
            AsyncArray<Box> edge_boxes_aa(edge_boxes.data(), n_edge_boxes);
            Box* boxes_p = edge_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : edge_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_edge_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        Vector<Box> corner_boxes;
        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) corner_boxes.push_back(tmp);
        }
        const int n_corner_boxes = corner_boxes.size();
        if (n_corner_boxes == 1) {
            amrex::ParallelFor(corner_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_corner_boxes > 1) {
            AsyncArray<Box> corner_boxes_aa(corner_boxes.data(), n_corner_boxes);
            Box* boxes_p = corner_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : corner_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_corner_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#else
    BCRec const* bcr_p = bcr.data()+bcomp;

    const auto& f_user = m_user_f;

    // fill on the box faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = {{ AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                 AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) }};

        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif

        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on box corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#endif
}